

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

int run_test_fs_event_start_and_close(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_e8 [4];
  int r;
  uv_fs_event_t fs_event2;
  uv_fs_event_t fs_event1;
  uv_loop_t *loop;
  
  loop_00 = uv_default_loop();
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(loop_00,(uv_fs_event_t *)&fs_event2.wd);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x3ef,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_event_start((uv_fs_event_t *)&fs_event2.wd,fs_event_cb_dir,"watch_dir",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x3f1,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_event_init(loop_00,(uv_fs_event_t *)local_e8);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x3f4,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_event_start((uv_fs_event_t *)local_e8,fs_event_cb_dir,"watch_dir",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x3f6,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)local_e8,close_cb);
  uv_close((uv_handle_t *)&fs_event2.wd,close_cb);
  uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x3fd,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  remove("watch_dir/");
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x400,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_event_start_and_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  uv_fs_event_t fs_event1;
  uv_fs_event_t fs_event2;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event1);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event1, fs_event_cb_dir, "watch_dir", 0);
  ASSERT_OK(r);

  r = uv_fs_event_init(loop, &fs_event2);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event2, fs_event_cb_dir, "watch_dir", 0);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) &fs_event2, close_cb);
  uv_close((uv_handle_t*) &fs_event1, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}